

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O3

void TestSignalingNanSingle(void)

{
  return;
}

Assistant:

TEST(SignalingNanSingle) {
  Single nan(Single::NaN());
  CHECK(nan.IsNan());
  CHECK(nan.IsQuietNan());
  CHECK(Single(std::numeric_limits<float>::quiet_NaN()).IsQuietNan());
  CHECK(Single(std::numeric_limits<float>::signaling_NaN()).IsSignalingNan());
}